

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MahjongGB.cpp
# Opt level: O2

vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* MahjongFanCalculator
            (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            *pack,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *hand,string *winTile,int flowerCount,bool isZIMO,bool isJUEZHANG,bool isGANG,
            bool isLAST,int menFeng,int quanFeng)

{
  undefined2 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  byte *pbVar8;
  string *psVar9;
  ushort uVar10;
  pointer ppVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  pointer pbVar15;
  long lVar16;
  pointer ppVar17;
  calculate_param_t calculate_param;
  undefined1 local_110 [40];
  pair<int,_const_char_*> local_e8;
  fan_table_t fan_table;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  calculate_param.hand_tiles.fixed_packs[0] = 0;
  calculate_param.hand_tiles.fixed_packs[1] = 0;
  calculate_param.hand_tiles.fixed_packs[2] = 0;
  calculate_param.hand_tiles.fixed_packs[3] = 0;
  calculate_param.hand_tiles.fixed_packs[4] = 0;
  calculate_param.hand_tiles._10_6_ = 0;
  calculate_param.hand_tiles.pack_count = 0;
  calculate_param.hand_tiles.standing_tiles[0] = '\0';
  calculate_param.hand_tiles.standing_tiles[1] = '\0';
  calculate_param.hand_tiles.standing_tiles[2] = '\0';
  calculate_param.hand_tiles.standing_tiles[3] = '\0';
  calculate_param.hand_tiles.standing_tiles[4] = '\0';
  calculate_param.hand_tiles.standing_tiles[5] = '\0';
  calculate_param.hand_tiles.standing_tiles[6] = '\0';
  calculate_param.hand_tiles.standing_tiles[7] = '\0';
  calculate_param.hand_tiles.standing_tiles[8] = '\0';
  calculate_param.hand_tiles.standing_tiles[9] = '\0';
  calculate_param.hand_tiles.standing_tiles[10] = '\0';
  calculate_param.hand_tiles.standing_tiles[0xb] = '\0';
  calculate_param.hand_tiles.standing_tiles[0xc] = '\0';
  calculate_param.hand_tiles._37_3_ = 0;
  calculate_param.hand_tiles.tile_count = 0;
  calculate_param.win_tile = '\0';
  calculate_param.flower_count = '\0';
  calculate_param.win_flag = '\0';
  calculate_param._51_1_ = 0;
  calculate_param.prevalent_wind = EAST;
  calculate_param.seat_wind = EAST;
  calculate_param._60_4_ = 0;
  memset(fan_table,0,0xa6);
  pbVar15 = (hand->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (hand->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  calculate_param.hand_tiles.tile_count = (long)pbVar5 - (long)pbVar15 >> 5;
  for (uVar12 = 0; uVar13 = (ulong)uVar12, uVar13 < (ulong)((long)pbVar5 - (long)pbVar15 >> 5);
      uVar12 = uVar12 + 1) {
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&str2tile_abi_cxx11_._M_h,pbVar15 + uVar13);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
        ._M_cur == (__node_type *)0x0) {
      psVar9 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(psVar9,"ERROE_WRONG_TILE_CODE",(allocator *)local_110);
      __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&str2tile_abi_cxx11_,
                          (hand->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar13);
    calculate_param.hand_tiles.standing_tiles[uVar13] = *pmVar7;
    pbVar15 = (hand->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (hand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  ppVar17 = (pack->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar11 = (pack->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  calculate_param.hand_tiles.pack_count = ((long)ppVar11 - (long)ppVar17) / 0x48;
  for (uVar12 = 0; uVar13 = (ulong)uVar12, uVar13 < (ulong)(((long)ppVar11 - (long)ppVar17) / 0x48);
      uVar12 = uVar12 + 1) {
    ppVar17 = ppVar17 + uVar13;
    bVar3 = std::operator==(&ppVar17->first,"PENG");
    if (bVar3) {
      iVar4 = (ppVar17->second).second;
      pbVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&str2tile_abi_cxx11_,&(ppVar17->second).first);
      uVar10 = 0x200;
    }
    else {
      bVar3 = std::operator==(&ppVar17->first,"GANG");
      if (bVar3) {
        iVar4 = (ppVar17->second).second;
        pbVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&str2tile_abi_cxx11_,&(ppVar17->second).first);
        uVar10 = 0x300;
      }
      else {
        bVar3 = std::operator==(&ppVar17->first,"CHI");
        if (!bVar3) {
          psVar9 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string(psVar9,"ERROE_WRONG_PACK_CODE",(allocator *)local_110);
          __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        iVar4 = (ppVar17->second).second;
        pbVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&str2tile_abi_cxx11_,&(ppVar17->second).first);
        uVar10 = 0x100;
      }
    }
    calculate_param.hand_tiles.fixed_packs[uVar13] =
         uVar10 | (ushort)(iVar4 << 0xc) | (ushort)*pbVar8;
    ppVar17 = (pack->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = (pack->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&str2tile_abi_cxx11_,winTile);
  uVar2 = calculate_param._48_8_;
  calculate_param.flower_count = (uint8_t)flowerCount;
  calculate_param.win_tile = *pmVar7;
  uVar1 = calculate_param._48_2_;
  if (isZIMO) {
    calculate_param.win_flag = SUB81(uVar2,2);
    calculate_param._51_5_ = SUB85(uVar2,3);
    calculate_param._48_4_ =
         (uint)CONCAT53(calculate_param._51_5_,CONCAT12(calculate_param.win_flag,uVar1)) | 0x10000;
  }
  if (isLAST) {
    calculate_param._48_4_ = calculate_param._48_4_ | 0x80000;
  }
  if (isJUEZHANG) {
    calculate_param._48_4_ = calculate_param._48_4_ | 0x20000;
  }
  if (isGANG) {
    calculate_param._48_4_ = calculate_param._48_4_ | 0x40000;
  }
  calculate_param.prevalent_wind = quanFeng;
  calculate_param.seat_wind = menFeng;
  iVar4 = mahjong::calculate_fan(&calculate_param,&fan_table);
  if (iVar4 != -3) {
    if (iVar4 == -2) {
      psVar9 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(psVar9,"ERROR_TILE_COUNT_GREATER_THAN_4",(allocator *)local_110);
      __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if (iVar4 != -1) {
      piVar14 = &_ZN7mahjongL8fan_nameE_rel;
      for (lVar16 = 0; lVar16 != 0xa6; lVar16 = lVar16 + 2) {
        if (*(ushort *)((long)fan_table + lVar16) != 0) {
          local_e8.first =
               (uint)*(ushort *)((long)&mahjong::fan_value_table + lVar16) *
               (uint)*(ushort *)((long)fan_table + lVar16);
          local_e8.second = (char *)((long)&_ZN7mahjongL8fan_nameE_rel + (long)*piVar14);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<int,_const_char_*,_true>
                    ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_110,&local_e8);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<std::pair<int,std::__cxx11::string>>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)__return_storage_ptr__,
                     (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_110);
          std::__cxx11::string::~string((string *)(local_110 + 8));
        }
        piVar14 = piVar14 + 1;
      }
      return __return_storage_ptr__;
    }
    psVar9 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(psVar9,"ERROR_WRONG_TILES_COUNT",(allocator *)local_110);
    __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  psVar9 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(psVar9,"ERROR_NOT_WIN",(allocator *)local_110);
  __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

vector<pair<int, string> > MahjongFanCalculator(
    vector<pair<string, pair<string, int> > > pack,
    vector<string> hand,
    string winTile,
    int flowerCount,
    bool isZIMO,
    bool isJUEZHANG,
    bool isGANG,
    bool isLAST,
    int menFeng,
    int quanFeng)
{
    vector<pair<int,string>> ans;
    mahjong::calculate_param_t calculate_param;
    mahjong::fan_table_t fan_table;
    memset(&calculate_param, 0, sizeof(mahjong::calculate_param_t));
    memset(&fan_table, 0, sizeof(mahjong::fan_table_t));
    calculate_param.hand_tiles.tile_count = hand.size();
    for(unsigned int i = 0; i < hand.size(); i++) {
        if(str2tile.find(hand[i]) == str2tile.end()){
            throw string("ERROE_WRONG_TILE_CODE");
        }
        calculate_param.hand_tiles.standing_tiles[i] = str2tile[hand[i]];
    }
    calculate_param.hand_tiles.pack_count = pack.size();
    for(unsigned int i = 0; i < pack.size(); i++) {
        pair<string, pair<string, int>> &sPack = pack[i];
        mahjong::pack_t &dPack = calculate_param.hand_tiles.fixed_packs[i];
        if(sPack.first == "PENG") {
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_PUNG, str2tile[sPack.second.first]);
        } else if(sPack.first == "GANG") {
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_KONG, str2tile[sPack.second.first]);
        } else if(sPack.first == "CHI"){
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_CHOW, str2tile[sPack.second.first]);
        } else {
            throw string("ERROE_WRONG_PACK_CODE");
        }
    }
    calculate_param.win_tile = str2tile[winTile];
    calculate_param.flower_count = flowerCount;
    if(isZIMO) {
        calculate_param.win_flag |= WIN_FLAG_SELF_DRAWN;
    }
    if(isLAST) {
        calculate_param.win_flag |= WIN_FLAG_WALL_LAST;
    }
    if(isJUEZHANG) {
        calculate_param.win_flag |= WIN_FLAG_4TH_TILE;
    }
    if(isGANG) {
        calculate_param.win_flag |= WIN_FLAG_ABOUT_KONG;
    }
    calculate_param.prevalent_wind = (mahjong::wind_t)quanFeng;
    calculate_param.seat_wind = (mahjong::wind_t)menFeng;
    int re = mahjong::calculate_fan(&calculate_param, &fan_table);
    if(re == -1) {
        throw string("ERROR_WRONG_TILES_COUNT");
    }else if(re == -2) {
        throw string("ERROR_TILE_COUNT_GREATER_THAN_4");
    }else if(re == -3) {
        throw string("ERROR_NOT_WIN");
    }
    for(int i = 0; i < mahjong::FAN_TABLE_SIZE; i++) {
        if(fan_table[i] > 0) {
            ans.push_back(make_pair(fan_table[i]*mahjong::fan_value_table[i],mahjong::fan_name[i]));
        }
    }
    return ans;
}